

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

uint getNextVectorRegister(uint Reg,uint Stride)

{
  uint uVar1;
  uint local_10;
  uint local_c;
  uint Stride_local;
  uint Reg_local;
  
  local_10 = Stride;
  local_c = Reg;
  while (uVar1 = local_10 - 1, local_10 != 0) {
    local_10 = uVar1;
    switch(local_c) {
    default:
      local_c = 0x69;
      break;
    case 0x69:
      local_c = 0x6a;
      break;
    case 0x6a:
      local_c = 0x6b;
      break;
    case 0x6b:
      local_c = 0x6c;
      break;
    case 0x6c:
      local_c = 0x6d;
      break;
    case 0x6d:
      local_c = 0x6e;
      break;
    case 0x6e:
      local_c = 0x6f;
      break;
    case 0x6f:
      local_c = 0x70;
      break;
    case 0x70:
      local_c = 0x71;
      break;
    case 0x71:
      local_c = 0x72;
      break;
    case 0x72:
      local_c = 0x73;
      break;
    case 0x73:
      local_c = 0x74;
      break;
    case 0x74:
      local_c = 0x75;
      break;
    case 0x75:
      local_c = 0x76;
      break;
    case 0x76:
      local_c = 0x77;
      break;
    case 0x77:
      local_c = 0x78;
      break;
    case 0x78:
      local_c = 0x79;
      break;
    case 0x79:
      local_c = 0x7a;
      break;
    case 0x7a:
      local_c = 0x7b;
      break;
    case 0x7b:
      local_c = 0x7c;
      break;
    case 0x7c:
      local_c = 0x7d;
      break;
    case 0x7d:
      local_c = 0x7e;
      break;
    case 0x7e:
      local_c = 0x7f;
      break;
    case 0x7f:
      local_c = 0x80;
      break;
    case 0x80:
      local_c = 0x81;
      break;
    case 0x81:
      local_c = 0x82;
      break;
    case 0x82:
      local_c = 0x83;
      break;
    case 0x83:
      local_c = 0x84;
      break;
    case 0x84:
      local_c = 0x85;
      break;
    case 0x85:
      local_c = 0x86;
      break;
    case 0x86:
      local_c = 0x87;
      break;
    case 0x87:
      local_c = 0x68;
    }
  }
  return local_c;
}

Assistant:

static unsigned getNextVectorRegister(unsigned Reg, unsigned Stride)
{
	while (Stride--) {
		switch (Reg) {
			default:
				// llvm_unreachable("Vector register expected!");
			case AArch64_Q0:  Reg = AArch64_Q1;  break;
			case AArch64_Q1:  Reg = AArch64_Q2;  break;
			case AArch64_Q2:  Reg = AArch64_Q3;  break;
			case AArch64_Q3:  Reg = AArch64_Q4;  break;
			case AArch64_Q4:  Reg = AArch64_Q5;  break;
			case AArch64_Q5:  Reg = AArch64_Q6;  break;
			case AArch64_Q6:  Reg = AArch64_Q7;  break;
			case AArch64_Q7:  Reg = AArch64_Q8;  break;
			case AArch64_Q8:  Reg = AArch64_Q9;  break;
			case AArch64_Q9:  Reg = AArch64_Q10; break;
			case AArch64_Q10: Reg = AArch64_Q11; break;
			case AArch64_Q11: Reg = AArch64_Q12; break;
			case AArch64_Q12: Reg = AArch64_Q13; break;
			case AArch64_Q13: Reg = AArch64_Q14; break;
			case AArch64_Q14: Reg = AArch64_Q15; break;
			case AArch64_Q15: Reg = AArch64_Q16; break;
			case AArch64_Q16: Reg = AArch64_Q17; break;
			case AArch64_Q17: Reg = AArch64_Q18; break;
			case AArch64_Q18: Reg = AArch64_Q19; break;
			case AArch64_Q19: Reg = AArch64_Q20; break;
			case AArch64_Q20: Reg = AArch64_Q21; break;
			case AArch64_Q21: Reg = AArch64_Q22; break;
			case AArch64_Q22: Reg = AArch64_Q23; break;
			case AArch64_Q23: Reg = AArch64_Q24; break;
			case AArch64_Q24: Reg = AArch64_Q25; break;
			case AArch64_Q25: Reg = AArch64_Q26; break;
			case AArch64_Q26: Reg = AArch64_Q27; break;
			case AArch64_Q27: Reg = AArch64_Q28; break;
			case AArch64_Q28: Reg = AArch64_Q29; break;
			case AArch64_Q29: Reg = AArch64_Q30; break;
			case AArch64_Q30: Reg = AArch64_Q31; break;
							   // Vector lists can wrap around.
			case AArch64_Q31: Reg = AArch64_Q0; break;
		}
	}

	return Reg;
}